

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTrav.c
# Opt level: O0

void Tim_ManSetPreviousTravIdBoxInputs(Tim_Man_t *p,int iBox)

{
  Tim_Box_t *pBox_00;
  bool bVar1;
  int local_2c;
  Tim_Obj_t *pTStack_28;
  int i;
  Tim_Obj_t *pObj;
  Tim_Box_t *pBox;
  int iBox_local;
  Tim_Man_t *p_local;
  
  pBox_00 = Tim_ManBox(p,iBox);
  local_2c = 0;
  while( true ) {
    bVar1 = false;
    if (local_2c < pBox_00->nInputs) {
      pTStack_28 = Tim_ManBoxInput(p,pBox_00,local_2c);
      bVar1 = pTStack_28 != (Tim_Obj_t *)0x0;
    }
    if (!bVar1) break;
    pTStack_28->TravId = p->nTravIds + -1;
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Tim_ManSetPreviousTravIdBoxInputs( Tim_Man_t * p, int iBox )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    int i;
    pBox = Tim_ManBox( p, iBox );
    Tim_ManBoxForEachInput( p, pBox, pObj, i )
        pObj->TravId = p->nTravIds - 1;
}